

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O3

void t2_hints_stems(T2_Hints hints,FT_UInt dimension,FT_Int count,FT_Fixed *coords)

{
  bool bVar1;
  FT_Fixed FVar2;
  uint uVar3;
  long a;
  uint count_00;
  ulong uVar4;
  FT_Pos stems [32];
  FT_Long local_138;
  long alStack_130 [32];
  
  if (0 < count) {
    a = 0;
    do {
      count_00 = 0x10;
      if ((uint)count < 0x10) {
        count_00 = count;
      }
      uVar4 = 0;
      do {
        a = a + coords[uVar4];
        FVar2 = FT_RoundFix(a);
        alStack_130[uVar4 - 1] = FVar2 >> 0x10;
        uVar4 = uVar4 + 1;
      } while (count_00 * 2 != uVar4);
      uVar4 = 0;
      do {
        alStack_130[uVar4] = alStack_130[uVar4] - alStack_130[uVar4 - 1];
        uVar4 = uVar4 + 2;
      } while (uVar4 < count_00 * 2);
      ps_hints_stem((PS_Hints)hints,dimension,count_00,&local_138);
      uVar3 = count - count_00;
      bVar1 = (int)count_00 <= count;
      count = uVar3;
    } while (uVar3 != 0 && bVar1);
  }
  return;
}

Assistant:

static void
  t2_hints_stems( T2_Hints   hints,
                  FT_UInt    dimension,
                  FT_Int     count,
                  FT_Fixed*  coords )
  {
    FT_Pos  stems[32], y;
    FT_Int  total = count, n;


    y = 0;
    while ( total > 0 )
    {
      /* determine number of stems to write */
      count = total;
      if ( count > 16 )
        count = 16;

      /* compute integer stem positions in font units */
      for ( n = 0; n < count * 2; n++ )
      {
        y        = ADD_LONG( y, coords[n] );
        stems[n] = FIXED_TO_INT( y );
      }

      /* compute lengths */
      for ( n = 0; n < count * 2; n += 2 )
        stems[n + 1] = stems[n + 1] - stems[n];

      /* add them to the current dimension */
      ps_hints_stem( (PS_Hints)hints, dimension, count, stems );

      total -= count;
    }
  }